

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCallback.cpp
# Opt level: O3

void __thiscall libebml::IOCallback::readFully(IOCallback *this,void *Buffer,size_t Size)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  stringstream Msg;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (Buffer == (void *)0x0) {
    __cxa_rethrow();
  }
  else {
    uVar1 = (*this->_vptr_IOCallback[2])();
    if (uVar1 == Size) {
      return;
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"EOF in readFully(",0x11);
  poVar2 = std::ostream::_M_insert<void_const*>(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IOCallback::readFully(void*Buffer,size_t Size)
{
  if(Buffer == NULL)
    throw;

  if(read(Buffer,Size) != Size) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"EOF in readFully("<<Buffer<<","<<Size<<")";
    throw runtime_error(Msg.str());
#endif // GCC2
  }
}